

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  bool bVar1;
  CppType CVar2;
  int iVar3;
  int64_t iVar4;
  LogMessage *pLVar5;
  undefined4 extraout_var;
  LogFinisher local_102;
  byte local_101;
  LogMessage local_100;
  LogFinisher local_c2;
  byte local_c1;
  LogMessage local_c0;
  LogFinisher local_85 [20];
  byte local_71;
  LogMessage local_70;
  Extension *local_38;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  MessageLite *prototype_local;
  FieldType type_local;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)descriptor;
  descriptor_local = (FieldDescriptor *)prototype;
  prototype_local._3_1_ = type;
  prototype_local._4_4_ = number;
  pEStack_18 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,&local_38);
  if (bVar1) {
    local_38->type = prototype_local._3_1_;
    CVar2 = anon_unknown_22::cpp_type(local_38->type);
    local_71 = 0;
    if (CVar2 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x288);
      local_71 = 1;
      pLVar5 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(local_85,pLVar5);
    }
    if ((local_71 & 1) != 0) {
      LogMessage::~LogMessage(&local_70);
    }
    local_38->is_repeated = false;
    local_38->field_0xa = local_38->field_0xa & 0xf;
    iVar4 = (**(code **)(*(long *)descriptor_local + 0x18))(descriptor_local,this->arena_);
    (local_38->field_0).int64_t_value = iVar4;
    local_38->field_0xa = local_38->field_0xa & 0xf0;
    this_local = (ExtensionSet *)(local_38->field_0).string_value;
  }
  else {
    local_c1 = 0;
    if ((local_38->is_repeated & 1U) != 0) {
      LogMessage::LogMessage
                (&local_c0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x28f);
      local_c1 = 1;
      pLVar5 = LogMessage::operator<<
                         (&local_c0,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(&local_c2,pLVar5);
    }
    if ((local_c1 & 1) != 0) {
      LogMessage::~LogMessage(&local_c0);
    }
    CVar2 = anon_unknown_22::cpp_type(local_38->type);
    local_101 = 0;
    if (CVar2 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_100,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x28f);
      local_101 = 1;
      pLVar5 = LogMessage::operator<<
                         (&local_100,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_102,pLVar5);
    }
    if ((local_101 & 1) != 0) {
      LogMessage::~LogMessage(&local_100);
    }
    local_38->field_0xa = local_38->field_0xa & 0xf0;
    if (((byte)local_38->field_0xa >> 4 & 1) == 0) {
      this_local = (ExtensionSet *)(local_38->field_0).string_value;
    }
    else {
      iVar3 = (*((local_38->field_0).message_value)->_vptr_MessageLite[4])
                        ((local_38->field_0).message_value,descriptor_local,this->arena_);
      this_local = (ExtensionSet *)CONCAT44(extraout_var,iVar3);
    }
  }
  return (MessageLite *)this_local;
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(int number, FieldType type,
                                          const MessageLite& prototype,
                                          const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    extension->message_value = prototype.New(arena_);
    extension->is_cleared = false;
    return extension->message_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->lazymessage_value->MutableMessage(prototype, arena_);
    } else {
      return extension->message_value;
    }
  }
}